

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filterednormalizer2.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::FilteredNormalizer2::normalize
          (FilteredNormalizer2 *this,UnicodeString *src,UnicodeString *dest,
          USetSpanCondition spanCondition,UErrorCode *errorCode)

{
  ushort uVar1;
  short sVar2;
  Normalizer2 *pNVar3;
  bool bVar4;
  uint uVar5;
  int32_t iVar6;
  int iVar7;
  undefined4 extraout_var;
  char16_t *pcVar8;
  ulong uVar9;
  uint uVar10;
  uint start;
  UnicodeString tempDest;
  UnicodeString local_b0;
  UnicodeString local_70;
  UnicodeString *src_00;
  
  local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00401be0;
  local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
  start = 0;
  do {
    uVar1 = (src->fUnion).fStackFields.fLengthAndFlags;
    if ((short)uVar1 < 0) {
      iVar7 = (src->fUnion).fFields.fLength;
    }
    else {
      iVar7 = (int)(short)uVar1 >> 5;
    }
    if (iVar7 <= (int)start) break;
    pcVar8 = (char16_t *)((long)&src->fUnion + 2);
    if ((uVar1 & 2) == 0) {
      pcVar8 = (src->fUnion).fFields.fArray;
    }
    if ((uVar1 & 0x11) != 0) {
      pcVar8 = (char16_t *)0x0;
    }
    uVar9 = 0;
    if (0 < (int)start) {
      uVar9 = (ulong)start;
    }
    iVar6 = UnicodeSet::span(this->set,pcVar8 + uVar9,iVar7 - (int)uVar9,spanCondition);
    uVar10 = iVar6 + (int)uVar9;
    uVar5 = uVar10;
    if (spanCondition == USET_SPAN_NOT_CONTAINED) {
      spanCondition = USET_SPAN_SIMPLE;
      bVar4 = true;
      if (uVar10 != start) {
        UnicodeString::doAppend(dest,src,start,uVar10 - start);
      }
    }
    else {
      if (uVar10 != start) {
        pNVar3 = this->norm2;
        UnicodeString::tempSubString(&local_70,src,start,uVar10 - start);
        iVar7 = (*(pNVar3->super_UObject)._vptr_UObject[3])(pNVar3,&local_70,&local_b0,errorCode);
        src_00 = (UnicodeString *)CONCAT44(extraout_var,iVar7);
        sVar2 = (src_00->fUnion).fStackFields.fLengthAndFlags;
        if (sVar2 < 0) {
          iVar6 = (src_00->fUnion).fFields.fLength;
        }
        else {
          iVar6 = (int)sVar2 >> 5;
        }
        UnicodeString::doAppend(dest,src_00,0,iVar6);
        UnicodeString::~UnicodeString(&local_70);
        bVar4 = false;
        uVar5 = start;
        if (U_ZERO_ERROR < *errorCode) goto LAB_0031b6e3;
      }
      bVar4 = true;
      spanCondition = USET_SPAN_NOT_CONTAINED;
      uVar5 = uVar10;
    }
LAB_0031b6e3:
    start = uVar5;
  } while (bVar4);
  UnicodeString::~UnicodeString(&local_b0);
  return dest;
}

Assistant:

UnicodeString &
FilteredNormalizer2::normalize(const UnicodeString &src,
                               UnicodeString &dest,
                               USetSpanCondition spanCondition,
                               UErrorCode &errorCode) const {
    UnicodeString tempDest;  // Don't throw away destination buffer between iterations.
    for(int32_t prevSpanLimit=0; prevSpanLimit<src.length();) {
        int32_t spanLimit=set.span(src, prevSpanLimit, spanCondition);
        int32_t spanLength=spanLimit-prevSpanLimit;
        if(spanCondition==USET_SPAN_NOT_CONTAINED) {
            if(spanLength!=0) {
                dest.append(src, prevSpanLimit, spanLength);
            }
            spanCondition=USET_SPAN_SIMPLE;
        } else {
            if(spanLength!=0) {
                // Not norm2.normalizeSecondAndAppend() because we do not want
                // to modify the non-filter part of dest.
                dest.append(norm2.normalize(src.tempSubStringBetween(prevSpanLimit, spanLimit),
                                            tempDest, errorCode));
                if(U_FAILURE(errorCode)) {
                    break;
                }
            }
            spanCondition=USET_SPAN_NOT_CONTAINED;
        }
        prevSpanLimit=spanLimit;
    }
    return dest;
}